

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_fail_example.cpp
# Opt level: O2

void foo2(int *a)

{
  ostream *poVar1;
  saver_fail<int_&> SAVER_FAIL_1;
  state_saver<int_&,_nstd::detail::on_fail_policy> local_20;
  
  local_20.policy_.ec_ = std::uncaught_exceptions();
  local_20.previous_value_ = *a;
  *a = 2;
  local_20.previous_ref_ = a;
  poVar1 = std::operator<<((ostream *)&std::cout,"foo2 a = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*a);
  std::endl<char,std::char_traits<char>>(poVar1);
  nstd::detail::state_saver<int_&,_nstd::detail::on_fail_policy>::~state_saver(&local_20);
  return;
}

Assistant:

void foo2(int& a) {
  SAVER_FAIL(a); // State saver on fail.

  a = 2;
  std::cout << "foo2 a = " << a << std::endl;
  // Original state will not automatically restored, on scope leave when no exceptions have been thrown.
}